

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazy_bdecode.cpp
# Opt level: O3

string * __thiscall
libtorrent::lazy_entry::dict_find_string_value_abi_cxx11_
          (string *__return_storage_ptr__,lazy_entry *this,char *name)

{
  uint uVar1;
  lazy_dict_entry *plVar2;
  lazy_entry *plVar3;
  
  plVar3 = dict_find(this,name);
  if ((plVar3 != (lazy_entry *)0x0) &&
     (uVar1 = *(uint *)&plVar3->field_0x14, (uVar1 & 0xe0000000) == 0x60000000)) {
    plVar2 = (plVar3->m_data).dict;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,plVar2,
               (long)&plVar2->name + (ulong)(uVar1 & 0x1fffffff));
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string lazy_entry::dict_find_string_value(char const* name) const
	{
		lazy_entry const* e = dict_find(name);
		if (e == nullptr || e->type() != lazy_entry::string_t) return std::string();
		return e->string_value();
	}